

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qevdevmousemanager.cpp
# Opt level: O2

void __thiscall QEvdevMouseManager::clampPosition(QEvdevMouseManager *this)

{
  Representation RVar1;
  QScreen *context;
  int iVar2;
  long in_FS_OFFSET;
  QRect QVar3;
  QRect local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  context = (QScreen *)QGuiApplication::primaryScreen();
  local_28 = (QRect)QScreen::virtualGeometry();
  QVar3 = QHighDpi::toNativePixels<QRect,QScreen>(&local_28,context);
  iVar2 = this->m_x + this->m_xoffset;
  RVar1 = QVar3.x1.m_i;
  if ((iVar2 < RVar1.m_i) || (RVar1 = QVar3.x2.m_i, RVar1.m_i < iVar2)) {
    this->m_x = RVar1.m_i - this->m_xoffset;
  }
  iVar2 = this->m_y + this->m_yoffset;
  RVar1 = QVar3.y1.m_i;
  if (RVar1.m_i <= iVar2) {
    RVar1 = QVar3.y2.m_i;
    if (iVar2 <= RVar1.m_i) goto LAB_00106948;
  }
  this->m_y = RVar1.m_i - this->m_yoffset;
LAB_00106948:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QEvdevMouseManager::clampPosition()
{
    // clamp to screen geometry
    QScreen *primaryScreen = QGuiApplication::primaryScreen();
    QRect g = QHighDpi::toNativePixels(primaryScreen->virtualGeometry(), primaryScreen);
    if (m_x + m_xoffset < g.left())
        m_x = g.left() - m_xoffset;
    else if (m_x + m_xoffset > g.right())
        m_x = g.right() - m_xoffset;

    if (m_y + m_yoffset < g.top())
        m_y = g.top() - m_yoffset;
    else if (m_y + m_yoffset > g.bottom())
        m_y = g.bottom() - m_yoffset;
}